

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  long lVar1;
  SQObjectPtr *this_00;
  SQUnsignedInteger SVar2;
  bool bVar3;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_0013f810;
  this_00 = this->_values;
  this->_values[0].super_SQObject._type = OT_NULL;
  this->_values[0].super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_memsize = memsize;
  this->_class = c;
  SVar2 = (c->_defaultvalues)._size;
  lVar1 = 0;
  while (bVar3 = SVar2 != 0, SVar2 = SVar2 - 1, bVar3) {
    SQObjectPtr::SQObjectPtr
              (this_00,(SQObjectPtr *)
                       ((long)&(((this->_class->_defaultvalues)._vals)->val).super_SQObject._type +
                       lVar1));
    lVar1 = lVar1 + 0x20;
    this_00 = this_00 + 1;
  }
  Init(this,ss);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}